

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test::
~TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test
          (TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this)

{
  TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *mem;
  TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HonorTiles_Wind)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);

	s.setSeatWind(Tile::EastWind);	
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(2, r.doubling_factor);

	s.setRoundWind(Tile::SouthWind);
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);
}